

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O3

void t1_hints_open(T1_Hints hints)

{
  *(undefined4 *)(hints + 8) = 0;
  *(undefined4 *)(hints + 0x10) = 1;
  *(undefined4 *)(hints + 0x18) = 0;
  *(undefined4 *)(hints + 0x28) = 0;
  *(undefined4 *)(hints + 0x38) = 0;
  *(undefined4 *)(hints + 0x48) = 0;
  *(undefined4 *)(hints + 0x58) = 0;
  *(undefined4 *)(hints + 0x68) = 0;
  return;
}

Assistant:

static void
  t1_hints_open( T1_Hints  hints )
  {
    ps_hints_open( (PS_Hints)hints, PS_HINT_TYPE_1 );
  }